

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WavLog.cpp
# Opt level: O2

void WavParserHelper::PrintJunkChunk(JunkChunk rhs)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  string ckID;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ckID,rhs.ckID,(allocator<char> *)&local_70);
  std::__cxx11::string::resize((ulong)&ckID);
  std::operator+(&local_70,"ChunkID: ",&ckID);
  PrintLog(&local_70,(ostream *)&std::cout);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::to_string(&local_50,rhs.ckSize);
  std::operator+(&local_70,"ChunkSize: ",&local_50);
  PrintLog(&local_70,(ostream *)&std::cout);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__cxx11::string::~string((string *)&ckID);
  return;
}

Assistant:

void WavParserHelper::PrintJunkChunk(JunkChunk rhs)
{
	std::string ckID(rhs.ckID);
	ckID.resize(4);

	PrintLog("ChunkID: " + ckID);
	PrintLog("ChunkSize: " + std::to_string(rhs.ckSize));
	std::cout << std::endl;
}